

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorCheckClasses.cpp
# Opt level: O1

void __thiscall GdlGlyphIntersectionClassDefn::ComputeMembers(GdlGlyphIntersectionClassDefn *this)

{
  unsigned_short uVar1;
  ushort uVar2;
  iterator __position;
  unsigned_short *puVar3;
  pointer ppGVar4;
  GdlGlyphClassMember *pglfd;
  long lVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  vector<unsigned_short,_std::allocator<unsigned_short>_> vgidResult;
  vector<unsigned_short,_std::allocator<unsigned_short>_> vgid1;
  GrpLineAndFile lnf;
  unsigned_short local_9a;
  unsigned_short *local_98;
  iterator iStack_90;
  unsigned_short *local_88;
  void *local_78;
  void *pvStack_70;
  long local_68;
  void *local_58;
  _Alloc_hider _Stack_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  local_98 = (unsigned_short *)0x0;
  iStack_90._M_current = (unsigned_short *)0x0;
  local_88 = (unsigned_short *)0x0;
  local_68 = 0;
  local_78 = (void *)0x0;
  pvStack_70 = (void *)0x0;
  (*((*(this->m_vpglfdSets).
       super__Vector_base<GdlGlyphClassMember_*,_std::allocator<GdlGlyphClassMember_*>_>._M_impl.
       super__Vector_impl_data._M_start)->super_GdlDefn)._vptr_GdlDefn[0x12])();
  ppGVar4 = (this->m_vpglfdSets).
            super__Vector_base<GdlGlyphClassMember_*,_std::allocator<GdlGlyphClassMember_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (8 < (ulong)((long)(this->m_vpglfdSets).
                        super__Vector_base<GdlGlyphClassMember_*,_std::allocator<GdlGlyphClassMember_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppGVar4)) {
    uVar8 = 1;
    do {
      if (iStack_90._M_current != local_98) {
        iStack_90._M_current = local_98;
      }
      local_58 = (void *)0x0;
      _Stack_50._M_p = (pointer)0x0;
      local_48 = 0;
      (*(ppGVar4[uVar8]->super_GdlDefn)._vptr_GdlDefn[0x12])();
      if (pvStack_70 != local_78) {
        uVar6 = 0;
        do {
          if ((long)_Stack_50._M_p - (long)local_58 != 0) {
            lVar5 = (long)_Stack_50._M_p - (long)local_58 >> 1;
            uVar1 = *(unsigned_short *)((long)local_78 + uVar6 * 2);
            lVar7 = 0;
            do {
              if (*(unsigned_short *)((long)local_58 + lVar7 * 2) == uVar1) {
                if (iStack_90._M_current == local_88) {
                  std::vector<unsigned_short,std::allocator<unsigned_short>>::
                  _M_realloc_insert<unsigned_short_const&>
                            ((vector<unsigned_short,std::allocator<unsigned_short>> *)&local_98,
                             iStack_90,(unsigned_short *)((long)local_78 + uVar6 * 2));
                }
                else {
                  *iStack_90._M_current = uVar1;
                  iStack_90._M_current = iStack_90._M_current + 1;
                }
                break;
              }
              lVar7 = lVar7 + 1;
            } while (lVar5 + (ulong)(lVar5 == 0) != lVar7);
          }
          uVar6 = uVar6 + 1;
        } while (uVar6 < (ulong)((long)pvStack_70 - (long)local_78 >> 1));
      }
      std::vector<unsigned_short,std::allocator<unsigned_short>>::
      _M_assign_aux<__gnu_cxx::__normal_iterator<unsigned_short*,std::vector<unsigned_short,std::allocator<unsigned_short>>>>
                ((vector<unsigned_short,std::allocator<unsigned_short>> *)&local_78,local_98,
                 iStack_90._M_current);
      if (local_58 != (void *)0x0) {
        operator_delete(local_58,local_48 - (long)local_58);
      }
      uVar8 = uVar8 + 1;
      ppGVar4 = (this->m_vpglfdSets).
                super__Vector_base<GdlGlyphClassMember_*,_std::allocator<GdlGlyphClassMember_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while (uVar8 < (ulong)((long)(this->m_vpglfdSets).
                                   super__Vector_base<GdlGlyphClassMember_*,_std::allocator<GdlGlyphClassMember_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppGVar4 >> 3))
    ;
  }
  GrpLineAndFile::GrpLineAndFile
            ((GrpLineAndFile *)&local_58,
             &(this->super_GdlGlyphClassDefn).super_GdlGlyphClassMember.super_GdlDefn.
              super_GdlObject.m_lnf);
  if (iStack_90._M_current != local_98) {
    uVar8 = 0;
    do {
      puVar3 = local_98;
      pglfd = (GdlGlyphClassMember *)operator_new(0xb0);
      uVar2 = puVar3[uVar8];
      GdlObject::GdlObject(&(pglfd->super_GdlDefn).super_GdlObject);
      *(undefined8 *)&pglfd->m_fIsSpaceGlyph = 0x2ffffffff;
      (pglfd->super_GdlDefn)._vptr_GdlDefn = (_func_int **)&PTR__GdlGlyphDefn_00241c30;
      *(uint *)&pglfd[1].super_GdlDefn._vptr_GdlDefn = (uint)uVar2;
      *(uint *)((long)&pglfd[1].super_GdlDefn._vptr_GdlDefn + 4) = (uint)uVar2;
      *(undefined2 *)&pglfd[1].super_GdlDefn.super_GdlObject.m_lnf.m_nLinePre = 0;
      pglfd[1].super_GdlDefn.super_GdlObject.m_lnf.m_nLineOrig = 0;
      pglfd[1].super_GdlDefn.super_GdlObject.m_lnf.m_staFile._M_dataplus._M_p = (pointer)0x0;
      pglfd[1].super_GdlDefn.super_GdlObject.m_lnf.m_staFile._M_string_length =
           (size_type)((long)&pglfd[1].super_GdlDefn.super_GdlObject.m_lnf.m_staFile.field_2 + 8);
      pglfd[1].super_GdlDefn.super_GdlObject.m_lnf.m_staFile.field_2._M_allocated_capacity = 0;
      pglfd[1].super_GdlDefn.super_GdlObject.m_lnf.m_staFile.field_2._M_local_buf[8] = '\0';
      pglfd[2].super_GdlDefn._vptr_GdlDefn = (_func_int **)0x0;
      pglfd[2].super_GdlDefn.super_GdlObject.m_lnf.m_nLinePre = 0;
      pglfd[2].super_GdlDefn.super_GdlObject.m_lnf.m_nLineOrig = 0;
      pglfd[2].super_GdlDefn.super_GdlObject.m_lnf.m_staFile._M_dataplus._M_p = (pointer)0x0;
      pglfd[2].super_GdlDefn.super_GdlObject.m_lnf.m_staFile.field_2._M_allocated_capacity = 0;
      *(undefined8 *)((long)&pglfd[2].super_GdlDefn.super_GdlObject.m_lnf.m_staFile.field_2 + 8) = 0
      ;
      *(undefined8 *)((long)&pglfd[2].super_GdlDefn.super_GdlObject.m_lnf.m_staFile.field_2 + 10) =
           0;
      *(undefined8 *)((long)&pglfd[2].m_fIsSpaceGlyph + 2) = 0;
      local_9a = local_98[uVar8];
      __position._M_current = *(unsigned_short **)&pglfd[2].super_GdlDefn.super_GdlObject.m_lnf;
      if (__position._M_current ==
          (unsigned_short *)pglfd[2].super_GdlDefn.super_GdlObject.m_lnf.m_staFile._M_dataplus._M_p)
      {
        std::vector<unsigned_short,std::allocator<unsigned_short>>::
        _M_realloc_insert<unsigned_short_const&>
                  ((vector<unsigned_short,std::allocator<unsigned_short>> *)(pglfd + 2),__position,
                   &local_9a);
      }
      else {
        *__position._M_current = local_9a;
        *(unsigned_short **)&pglfd[2].super_GdlDefn.super_GdlObject.m_lnf =
             __position._M_current + 1;
      }
      GdlGlyphClassDefn::AddMember(&this->super_GdlGlyphClassDefn,pglfd,(GrpLineAndFile *)&local_58)
      ;
      uVar8 = uVar8 + 1;
    } while (uVar8 < (ulong)((long)iStack_90._M_current - (long)local_98 >> 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Stack_50._M_p != &local_40) {
    operator_delete(_Stack_50._M_p,local_40._M_allocated_capacity + 1);
  }
  if (local_78 != (void *)0x0) {
    operator_delete(local_78,local_68 - (long)local_78);
  }
  if (local_98 != (unsigned_short *)0x0) {
    operator_delete(local_98,(long)local_88 - (long)local_98);
  }
  return;
}

Assistant:

void GdlGlyphIntersectionClassDefn::ComputeMembers()
{
	std::vector<utf16> vgidResult;

	std::vector<utf16> vgid1;
	m_vpglfdSets[0]->FlattenGlyphList(vgid1);

	for (size_t iglfc = 1; iglfc < this->m_vpglfdSets.size(); iglfc++)
	{
		vgidResult.clear();
		std::vector<utf16> vgid2;
		m_vpglfdSets[iglfc]->FlattenGlyphList(vgid2);
		for (size_t igid1 = 0; igid1 < vgid1.size(); igid1++)
		{
			bool fFound = false;
			for (size_t igid2 = 0; igid2 < vgid2.size(); igid2++)
			{
				if (vgid2[igid2] == vgid1[igid1])
				{
					fFound = true;
					break;
				}
			}
			if (fFound)
				vgidResult.push_back(vgid1[igid1]);

		}
		vgid1.assign(vgidResult.begin(), vgidResult.end());
	}

	// Fake a simple class definition that contains these glyphs.
	GrpLineAndFile lnf = this->LineAndFile();
	for (size_t igid = 0; igid < vgidResult.size(); igid++)
	{
		GdlGlyphDefn * pglfd = new GdlGlyphDefn(kglftGlyphID, vgidResult[igid]);
		pglfd->AddGlyphID(vgidResult[igid]);
		this->AddMember(pglfd, lnf);
	}
}